

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,i64 nList)

{
  char *pcVar1;
  char *pcVar2;
  sqlite3_uint64 n;
  
  if (pMsr->nBuffer < nList + 0x14) {
    n = (sqlite3_uint64)((int)nList * 2 + 0x14);
    pcVar2 = (char *)sqlite3_realloc64(pMsr->aBuffer,n);
    if (pcVar2 == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = pcVar2;
    pMsr->nBuffer = n;
  }
  else {
    pcVar2 = pMsr->aBuffer;
  }
  memcpy(pcVar2,pList,nList);
  pcVar1 = pMsr->aBuffer;
  pcVar2 = pcVar1 + nList;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  pcVar1 = pcVar1 + nList + 0x10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  i64 nList
){
  if( (nList+FTS3_NODE_PADDING)>pMsr->nBuffer ){
    char *pNew;
    int nNew = nList*2 + FTS3_NODE_PADDING;
    pNew = (char *)sqlite3_realloc64(pMsr->aBuffer, nNew);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
    pMsr->nBuffer = nNew;
  }

  assert( nList>0 );
  memcpy(pMsr->aBuffer, pList, nList);
  memset(&pMsr->aBuffer[nList], 0, FTS3_NODE_PADDING);
  return SQLITE_OK;
}